

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_matcher.hpp
# Opt level: O1

bool __thiscall
boost::xpressive::detail::
set_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::int_<2>>
::
match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (set_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::int_<2>>
           *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *state,
          matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *next)

{
  set_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::int_<2>>
  sVar1;
  set_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::int_<2>>
  *psVar2;
  long *plVar3;
  set_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::int_<2>>
  sVar4;
  int iVar5;
  char_type *begin;
  
  psVar2 = (set_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::int_<2>>
            *)(state->cur_)._M_current;
  if (psVar2 == (set_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::int_<2>>
                 *)(state->end_)._M_current) {
    state->found_partial_match_ = true;
  }
  else {
    sVar1 = this[2];
    sVar4 = *psVar2;
    if (this[3] ==
        (set_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::int_<2>>
         )0x1) {
      plVar3 = *(long **)&(state->context_).traits_[0x21].
                          super_counted_base<boost::xpressive::detail::traits<char>_>;
      sVar4 = (set_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::int_<2>>
               )(**(code **)(*plVar3 + 0x20))(plVar3,(int)(char)sVar4);
    }
    if (sVar1 != (set_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::int_<2>>
                  )(this[1] == sVar4 || *this == sVar4)) {
      (state->cur_)._M_current = (state->cur_)._M_current + 1;
      iVar5 = (*(next->
                super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_matchable[2])(next,state);
      if ((char)iVar5 != '\0') {
        return true;
      }
      (state->cur_)._M_current = (state->cur_)._M_current + -1;
    }
  }
  return false;
}

Assistant:

bool match(match_state<BidiIter> &state, Next const &next) const
    {
        if(state.eos() || this->not_ == this->in_set(traits_cast<Traits>(state), *state.cur_))
        {
            return false;
        }

        if(++state.cur_, next.match(state))
        {
            return true;
        }

        return --state.cur_, false;
    }